

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QString,QConfFile*>::emplace<QConfFile*const&>
          (QHash<QString,QConfFile*> *this,QString *key,QConfFile **args)

{
  QConfFile *pQVar1;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QConfFile *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QConfFile **)this;
  if (pQVar1 == (QConfFile *)0x0) {
LAB_004404b8:
    pDVar2 = *(Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> **)this;
    local_28 = pQVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::detached(pDVar2);
      *(Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QConfFile*const&>(this,key,args);
    QHash<QString,_QConfFile_*>::~QHash((QHash<QString,_QConfFile_*> *)&local_28);
  }
  else {
    if (1 < *(uint *)&(pQVar1->name).d.d) {
      if ((pQVar1 != (QConfFile *)0x0) && (*(int *)&(pQVar1->name).d.d != -1)) {
        LOCK();
        *(int *)&(pQVar1->name).d.d = *(int *)&(pQVar1->name).d.d + 1;
        UNLOCK();
      }
      goto LAB_004404b8;
    }
    if ((pQVar1->name).d.ptr < (char16_t *)((ulong)(pQVar1->name).d.size >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QConfFile*const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_0044054e;
    }
    local_28 = *args;
    pVar3 = (piter)emplace_helper<QConfFile*>(this,key,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0044054e:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }